

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O1

void __thiscall
cmCMakePresetsGraph::PackagePreset::PackagePreset(PackagePreset *this,PackagePreset *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  optional<bool> oVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__PackagePreset_0088b9c8;
  paVar1 = &(this->ConfigurePreset).field_2;
  (this->ConfigurePreset)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->ConfigurePreset)._M_dataplus._M_p;
  paVar5 = &(param_1->ConfigurePreset).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&(param_1->ConfigurePreset).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ConfigurePreset).field_2 + 8) = uVar3;
  }
  else {
    (this->ConfigurePreset)._M_dataplus._M_p = pcVar2;
    (this->ConfigurePreset).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->ConfigurePreset)._M_string_length = (param_1->ConfigurePreset)._M_string_length;
  (param_1->ConfigurePreset)._M_dataplus._M_p = (pointer)paVar5;
  (param_1->ConfigurePreset)._M_string_length = 0;
  (param_1->ConfigurePreset).field_2._M_local_buf[0] = '\0';
  (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  (this->Generators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->Generators).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Generators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (param_1->Generators).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->Generators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->Generators).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->Generators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->Generators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->Generators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->Configurations).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (param_1->Configurations).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->Configurations).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->Variables)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->Variables)._M_t._M_impl.super__Rb_tree_header);
  paVar1 = &(this->ConfigFile).field_2;
  (this->ConfigFile)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->ConfigFile)._M_dataplus._M_p;
  paVar5 = &(param_1->ConfigFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&(param_1->ConfigFile).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ConfigFile).field_2 + 8) = uVar3;
  }
  else {
    (this->ConfigFile)._M_dataplus._M_p = pcVar2;
    (this->ConfigFile).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->ConfigFile)._M_string_length = (param_1->ConfigFile)._M_string_length;
  (param_1->ConfigFile)._M_dataplus._M_p = (pointer)paVar5;
  (param_1->ConfigFile)._M_string_length = 0;
  (param_1->ConfigFile).field_2._M_local_buf[0] = '\0';
  oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->VerboseOutput).super__Optional_base<bool,_true,_true>;
  this->DebugOutput =
       (_Optional_base<bool,_true,_true>)
       (param_1->DebugOutput).super__Optional_base<bool,_true,_true>;
  this->VerboseOutput =
       (optional<bool>)
       oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  paVar1 = &(this->PackageName).field_2;
  (this->PackageName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->PackageName)._M_dataplus._M_p;
  paVar5 = &(param_1->PackageName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&(param_1->PackageName).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->PackageName).field_2 + 8) = uVar3;
  }
  else {
    (this->PackageName)._M_dataplus._M_p = pcVar2;
    (this->PackageName).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->PackageName)._M_string_length = (param_1->PackageName)._M_string_length;
  (param_1->PackageName)._M_dataplus._M_p = (pointer)paVar5;
  (param_1->PackageName)._M_string_length = 0;
  (param_1->PackageName).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->PackageVersion).field_2;
  (this->PackageVersion)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->PackageVersion)._M_dataplus._M_p;
  paVar5 = &(param_1->PackageVersion).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&(param_1->PackageVersion).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->PackageVersion).field_2 + 8) = uVar3;
  }
  else {
    (this->PackageVersion)._M_dataplus._M_p = pcVar2;
    (this->PackageVersion).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->PackageVersion)._M_string_length = (param_1->PackageVersion)._M_string_length;
  (param_1->PackageVersion)._M_dataplus._M_p = (pointer)paVar5;
  (param_1->PackageVersion)._M_string_length = 0;
  (param_1->PackageVersion).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->PackageDirectory).field_2;
  (this->PackageDirectory)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->PackageDirectory)._M_dataplus._M_p;
  paVar5 = &(param_1->PackageDirectory).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&(param_1->PackageDirectory).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->PackageDirectory).field_2 + 8) = uVar3;
  }
  else {
    (this->PackageDirectory)._M_dataplus._M_p = pcVar2;
    (this->PackageDirectory).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->PackageDirectory)._M_string_length = (param_1->PackageDirectory)._M_string_length;
  (param_1->PackageDirectory)._M_dataplus._M_p = (pointer)paVar5;
  (param_1->PackageDirectory)._M_string_length = 0;
  (param_1->PackageDirectory).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->VendorName).field_2;
  (this->VendorName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->VendorName)._M_dataplus._M_p;
  paVar5 = &(param_1->VendorName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&(param_1->VendorName).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->VendorName).field_2 + 8) = uVar3;
  }
  else {
    (this->VendorName)._M_dataplus._M_p = pcVar2;
    (this->VendorName).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->VendorName)._M_string_length = (param_1->VendorName)._M_string_length;
  (param_1->VendorName)._M_dataplus._M_p = (pointer)paVar5;
  (param_1->VendorName)._M_string_length = 0;
  (param_1->VendorName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PackagePreset(PackagePreset&& /*other*/) = default;